

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O3

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  StkId pTVar6;
  StkId pTVar7;
  ulong uVar8;
  StkId pTVar9;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  auVar4 = _DAT_001164e0;
  auVar3 = _DAT_001164d0;
  auVar2 = _DAT_001164c0;
  if (idx < 0) {
    L->top = L->top + (long)idx + 1;
    return;
  }
  pTVar1 = L->top;
  pTVar7 = L->ci->func;
  pTVar6 = pTVar7 + (ulong)(uint)idx + 1;
  if (pTVar1 < pTVar6) {
    pTVar7 = pTVar7 + (ulong)(uint)idx + 1;
    pTVar9 = pTVar1 + 1;
    if (pTVar1 + 1 < pTVar7) {
      pTVar9 = pTVar7;
    }
    uVar8 = (long)&pTVar9->value_ + ~(ulong)pTVar1;
    auVar14._8_4_ = (int)uVar8;
    auVar14._0_8_ = uVar8;
    auVar14._12_4_ = (int)(uVar8 >> 0x20);
    auVar11._0_8_ = uVar8 >> 4;
    auVar11._8_8_ = auVar14._8_8_ >> 4;
    piVar5 = &pTVar1[3].tt_;
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_001164e0;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar14 = (auVar13 | auVar3) ^ auVar4;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        piVar5[-0xc] = 0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        piVar5[-8] = 0;
      }
      auVar14 = (auVar13 | auVar2) ^ auVar4;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar14._0_4_ <= auVar11._0_4_)) {
        piVar5[-4] = 0;
        *piVar5 = 0;
      }
      uVar10 = uVar10 + 4;
      piVar5 = piVar5 + 0x10;
    } while (((uVar8 >> 4) + 4 & 0xfffffffffffffffc) != uVar10);
  }
  L->top = pTVar6;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* `subtract' index (index is negative) */
  }
  lua_unlock(L);
}